

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

anon_enum_32 check_gzip_header(uchar *data,ssize_t len,ssize_t *headerlen)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ssize_t totallen;
  ushort *puVar5;
  ushort *puVar6;
  bool bVar7;
  
  if (len < 10) {
    return CURLIOCMD_LAST;
  }
  if (((*data != '\x1f') || (data[1] != 0x8b)) || (bVar1 = data[3], 0x1f < bVar1 || data[2] != '\b')
     ) {
    return CURLDIGESTALGO_MD5SESS;
  }
  uVar3 = len - 10;
  puVar5 = (ushort *)(data + 10);
  if ((bVar1 & 4) != 0) {
    if ((ulong)len < 0xc) {
      return CURLIOCMD_LAST;
    }
    uVar4 = (ulong)*puVar5 + 2;
    bVar7 = uVar3 < uVar4;
    uVar3 = uVar3 - uVar4;
    if (bVar7) {
      return CURLIOCMD_LAST;
    }
    puVar5 = (ushort *)((long)puVar5 + uVar4);
  }
  if ((bVar1 & 8) == 0) {
LAB_0012f668:
    if (bVar1 < 0x10) {
LAB_0012f691:
      if ((bVar1 & 2) != 0) {
        if ((long)uVar3 < 2) {
          return CURLIOCMD_LAST;
        }
        uVar3 = uVar3 - 2;
      }
      *headerlen = len - uVar3;
      return CURLDIGESTALGO_MD5;
    }
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        if (*(char *)((long)puVar5 + uVar4) == '\0') {
          uVar3 = uVar3 + ~uVar4;
          goto LAB_0012f691;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  else if (uVar3 != 0) {
    lVar2 = 1 - uVar3;
    puVar6 = puVar5;
    do {
      puVar5 = (ushort *)((long)puVar6 + 1);
      if ((char)*puVar6 == '\0') {
        uVar3 = -lVar2;
        goto LAB_0012f668;
      }
      lVar2 = lVar2 + 1;
      puVar6 = puVar5;
    } while (lVar2 != 1);
  }
  return CURLIOCMD_LAST;
}

Assistant:

static enum {
  GZIP_OK,
  GZIP_BAD,
  GZIP_UNDERFLOW
} check_gzip_header(unsigned char const *data, ssize_t len, ssize_t *headerlen)
{
  int method, flags;
  const ssize_t totallen = len;

  /* The shortest header is 10 bytes */
  if(len < 10)
    return GZIP_UNDERFLOW;

  if((data[0] != GZIP_MAGIC_0) || (data[1] != GZIP_MAGIC_1))
    return GZIP_BAD;

  method = data[2];
  flags = data[3];

  if(method != Z_DEFLATED || (flags & RESERVED) != 0) {
    /* Can't handle this compression method or unknown flag */
    return GZIP_BAD;
  }

  /* Skip over time, xflags, OS code and all previous bytes */
  len -= 10;
  data += 10;

  if(flags & EXTRA_FIELD) {
    ssize_t extra_len;

    if(len < 2)
      return GZIP_UNDERFLOW;

    extra_len = (data[1] << 8) | data[0];

    if(len < (extra_len+2))
      return GZIP_UNDERFLOW;

    len -= (extra_len + 2);
    data += (extra_len + 2);
  }

  if(flags & ORIG_NAME) {
    /* Skip over NUL-terminated file name */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
    ++data;
  }

  if(flags & COMMENT) {
    /* Skip over NUL-terminated comment */
    while(len && *data) {
      --len;
      ++data;
    }
    if(!len || *data)
      return GZIP_UNDERFLOW;

    /* Skip over the NUL */
    --len;
  }

  if(flags & HEAD_CRC) {
    if(len < 2)
      return GZIP_UNDERFLOW;

    len -= 2;
  }

  *headerlen = totallen - len;
  return GZIP_OK;
}